

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFOpcPackage.cpp
# Opt level: O1

string * __thiscall
Assimp::D3MF::D3MFOpcPackage::ReadPackageRootRelationship_abi_cxx11_
          (string *__return_storage_ptr__,D3MFOpcPackage *this,IOStream *stream)

{
  long lVar1;
  bool bVar2;
  CIrrXML_IOStreamReader *this_00;
  shared_ptr<Assimp::D3MF::OpcPackageRelationship> *xmlReader;
  runtime_error *this_01;
  long lVar3;
  __normal_iterator<std::shared_ptr<Assimp::D3MF::OpcPackageRelationship>_*,_std::vector<std::shared_ptr<Assimp::D3MF::OpcPackageRelationship>,_std::allocator<std::shared_ptr<Assimp::D3MF::OpcPackageRelationship>_>_>_>
  __it;
  _Iter_pred<Assimp::D3MF::D3MFOpcPackage::ReadPackageRootRelationship[abi:cxx11](Assimp::IOStream*)::__0>
  *this_02;
  _Iter_pred<Assimp::D3MF::D3MFOpcPackage::ReadPackageRootRelationship[abi:cxx11](Assimp::IOStream*)::__0>
  *p_Var4;
  _Iter_pred<Assimp::D3MF::D3MFOpcPackage::ReadPackageRootRelationship[abi:cxx11](Assimp::IOStream*)::__0>
  *this_03;
  OpcPackageRelationshipReader reader;
  OpcPackageRelationshipReader local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this_00 = (CIrrXML_IOStreamReader *)operator_new(0x30);
  CIrrXML_IOStreamReader::CIrrXML_IOStreamReader(this_00,stream);
  xmlReader = (shared_ptr<Assimp::D3MF::OpcPackageRelationship> *)
              irr::io::createIrrXMLReader((IFileReadCallBack *)this_00);
  __it._M_current = xmlReader;
  OpcPackageRelationshipReader::OpcPackageRelationshipReader(&local_68,(XmlReader *)xmlReader);
  lVar3 = (long)local_68.m_relationShips.
                super__Vector_base<std::shared_ptr<Assimp::D3MF::OpcPackageRelationship>,_std::allocator<std::shared_ptr<Assimp::D3MF::OpcPackageRelationship>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_68.m_relationShips.
                super__Vector_base<std::shared_ptr<Assimp::D3MF::OpcPackageRelationship>,_std::allocator<std::shared_ptr<Assimp::D3MF::OpcPackageRelationship>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 6;
  this_03 = (_Iter_pred<Assimp::D3MF::D3MFOpcPackage::ReadPackageRootRelationship[abi:cxx11](Assimp::IOStream*)::__0>
             *)local_68.m_relationShips.
               super__Vector_base<std::shared_ptr<Assimp::D3MF::OpcPackageRelationship>,_std::allocator<std::shared_ptr<Assimp::D3MF::OpcPackageRelationship>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
  if (0 < lVar3) {
    this_03 = (_Iter_pred<Assimp::D3MF::D3MFOpcPackage::ReadPackageRootRelationship[abi:cxx11](Assimp::IOStream*)::__0>
               *)((long)local_68.m_relationShips.
                        super__Vector_base<std::shared_ptr<Assimp::D3MF::OpcPackageRelationship>,_std::allocator<std::shared_ptr<Assimp::D3MF::OpcPackageRelationship>_>_>
                        ._M_impl.super__Vector_impl_data._M_start +
                 ((long)local_68.m_relationShips.
                        super__Vector_base<std::shared_ptr<Assimp::D3MF::OpcPackageRelationship>,_std::allocator<std::shared_ptr<Assimp::D3MF::OpcPackageRelationship>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_68.m_relationShips.
                        super__Vector_base<std::shared_ptr<Assimp::D3MF::OpcPackageRelationship>,_std::allocator<std::shared_ptr<Assimp::D3MF::OpcPackageRelationship>_>_>
                        ._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffffc0));
    lVar3 = lVar3 + 1;
    this_02 = (_Iter_pred<Assimp::D3MF::D3MFOpcPackage::ReadPackageRootRelationship[abi:cxx11](Assimp::IOStream*)::__0>
               *)local_68.m_relationShips.
                 super__Vector_base<std::shared_ptr<Assimp::D3MF::OpcPackageRelationship>,_std::allocator<std::shared_ptr<Assimp::D3MF::OpcPackageRelationship>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    do {
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<Assimp::D3MF::D3MFOpcPackage::ReadPackageRootRelationship[abi:cxx11](Assimp::IOStream*)::$_0>
              ::operator()(this_02,__it);
      p_Var4 = this_02;
      if (bVar2) goto LAB_0067883b;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<Assimp::D3MF::D3MFOpcPackage::ReadPackageRootRelationship[abi:cxx11](Assimp::IOStream*)::$_0>
              ::operator()(this_02 + 0x10,__it);
      p_Var4 = this_02 + 0x10;
      if (bVar2) goto LAB_0067883b;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<Assimp::D3MF::D3MFOpcPackage::ReadPackageRootRelationship[abi:cxx11](Assimp::IOStream*)::$_0>
              ::operator()(this_02 + 0x20,__it);
      p_Var4 = this_02 + 0x20;
      if (bVar2) goto LAB_0067883b;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<Assimp::D3MF::D3MFOpcPackage::ReadPackageRootRelationship[abi:cxx11](Assimp::IOStream*)::$_0>
              ::operator()(this_02 + 0x30,__it);
      p_Var4 = this_02 + 0x30;
      if (bVar2) goto LAB_0067883b;
      this_02 = this_02 + 0x40;
      lVar3 = lVar3 + -1;
    } while (1 < lVar3);
  }
  lVar3 = (long)local_68.m_relationShips.
                super__Vector_base<std::shared_ptr<Assimp::D3MF::OpcPackageRelationship>,_std::allocator<std::shared_ptr<Assimp::D3MF::OpcPackageRelationship>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)this_03 >> 4;
  if (lVar3 != 1) {
    if (lVar3 != 2) {
      p_Var4 = (_Iter_pred<Assimp::D3MF::D3MFOpcPackage::ReadPackageRootRelationship[abi:cxx11](Assimp::IOStream*)::__0>
                *)local_68.m_relationShips.
                  super__Vector_base<std::shared_ptr<Assimp::D3MF::OpcPackageRelationship>,_std::allocator<std::shared_ptr<Assimp::D3MF::OpcPackageRelationship>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      if ((lVar3 != 3) ||
         (bVar2 = __gnu_cxx::__ops::
                  _Iter_pred<Assimp::D3MF::D3MFOpcPackage::ReadPackageRootRelationship[abi:cxx11](Assimp::IOStream*)::$_0>
                  ::operator()(this_03,__it), p_Var4 = this_03, bVar2)) goto LAB_0067883b;
      this_03 = this_03 + 0x10;
    }
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<Assimp::D3MF::D3MFOpcPackage::ReadPackageRootRelationship[abi:cxx11](Assimp::IOStream*)::$_0>
            ::operator()(this_03,__it);
    p_Var4 = this_03;
    if (bVar2) goto LAB_0067883b;
    this_03 = this_03 + 0x10;
  }
  bVar2 = __gnu_cxx::__ops::
          _Iter_pred<Assimp::D3MF::D3MFOpcPackage::ReadPackageRootRelationship[abi:cxx11](Assimp::IOStream*)::$_0>
          ::operator()(this_03,__it);
  p_Var4 = this_03;
  if (!bVar2) {
    p_Var4 = (_Iter_pred<Assimp::D3MF::D3MFOpcPackage::ReadPackageRootRelationship[abi:cxx11](Assimp::IOStream*)::__0>
              *)local_68.m_relationShips.
                super__Vector_base<std::shared_ptr<Assimp::D3MF::OpcPackageRelationship>,_std::allocator<std::shared_ptr<Assimp::D3MF::OpcPackageRelationship>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  }
LAB_0067883b:
  if (p_Var4 == (_Iter_pred<Assimp::D3MF::D3MFOpcPackage::ReadPackageRootRelationship[abi:cxx11](Assimp::IOStream*)::__0>
                 *)local_68.m_relationShips.
                   super__Vector_base<std::shared_ptr<Assimp::D3MF::OpcPackageRelationship>,_std::allocator<std::shared_ptr<Assimp::D3MF::OpcPackageRelationship>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_50,"Cannot find ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &XmlTag::PACKAGE_START_PART_RELATIONSHIP_TYPE_abi_cxx11_);
    std::runtime_error::runtime_error(this_01,(string *)&local_50);
    *(undefined ***)this_01 = &PTR__runtime_error_0082bce0;
    __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  lVar3 = *(long *)p_Var4;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  lVar1 = *(long *)(lVar3 + 0x40);
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,lVar1,*(long *)(lVar3 + 0x48) + lVar1);
  std::
  vector<std::shared_ptr<Assimp::D3MF::OpcPackageRelationship>,_std::allocator<std::shared_ptr<Assimp::D3MF::OpcPackageRelationship>_>_>
  ::~vector(&local_68.m_relationShips);
  if (xmlReader != (shared_ptr<Assimp::D3MF::OpcPackageRelationship> *)0x0) {
    (*(code *)(((xmlReader->
                super___shared_ptr<Assimp::D3MF::OpcPackageRelationship,_(__gnu_cxx::_Lock_policy)2>
                )._M_ptr)->id)._M_string_length)();
  }
  (*(this_00->super_IFileReadCallBack)._vptr_IFileReadCallBack[1])(this_00);
  return __return_storage_ptr__;
}

Assistant:

std::string D3MFOpcPackage::ReadPackageRootRelationship(IOStream* stream) {
    std::unique_ptr<CIrrXML_IOStreamReader> xmlStream(new CIrrXML_IOStreamReader(stream));
    std::unique_ptr<XmlReader> xml(irr::io::createIrrXMLReader(xmlStream.get()));

    OpcPackageRelationshipReader reader(xml.get());

    auto itr = std::find_if(reader.m_relationShips.begin(), reader.m_relationShips.end(), [](const OpcPackageRelationshipPtr& rel){
        return rel->type == XmlTag::PACKAGE_START_PART_RELATIONSHIP_TYPE;
    });

    if ( itr == reader.m_relationShips.end() ) {
        throw DeadlyImportError( "Cannot find " + XmlTag::PACKAGE_START_PART_RELATIONSHIP_TYPE );
    }

    return (*itr)->target;
}